

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAllocPtr alloc)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  SRes SVar6;
  Byte *pBVar7;
  ulong uVar8;
  CLzmaProps *propNew;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  SVar6 = 4;
  if (4 < propsSize) {
    uVar2 = *(uint *)(props + 1);
    uVar10 = 0x1000;
    if (0x1000 < uVar2) {
      uVar10 = uVar2;
    }
    bVar1 = *props;
    if (bVar1 < 0xe1) {
      uVar5 = bVar1 / 9;
      cVar4 = (char)uVar5;
      bVar3 = cVar4 + (char)(uVar5 * 0x34 >> 8) * -5;
      propNew = (CLzmaProps *)(ulong)(byte)(bVar1 + cVar4 * -9);
      SVar6 = LzmaDec_AllocateProbs2(p,propNew,(ISzAllocPtr)(ulong)bVar3);
      if (SVar6 == 0) {
        uVar8 = 0xfff;
        if (0x3fffff < uVar2) {
          uVar8 = 0xfffff;
        }
        uVar9 = 0x3fffff;
        if (uVar2 < 0x40000000) {
          uVar9 = uVar8;
        }
        uVar11 = (ulong)uVar10;
        uVar8 = ~uVar9 & uVar11 + uVar9;
        if (uVar8 <= uVar11) {
          uVar8 = uVar11;
        }
        if ((p->dic == (Byte *)0x0) || (uVar8 != p->dicBufSize)) {
          (*alloc->Free)(alloc,p->dic);
          p->dic = (Byte *)0x0;
          pBVar7 = (Byte *)(*alloc->Alloc)(alloc,uVar8);
          p->dic = pBVar7;
          if (pBVar7 == (Byte *)0x0) {
            (*alloc->Free)(alloc,p->probs);
            p->probs = (CLzmaProb *)0x0;
            return 2;
          }
        }
        cVar4 = (char)((uint)bVar1 * 0x6d >> 8);
        p->dicBufSize = uVar8;
        p->prop = (CLzmaProps)
                  ((ulong)propNew |
                  (ulong)bVar3 << 8 |
                  (ulong)((byte)(((byte)(bVar1 - cVar4) >> 1) + cVar4) >> 5) << 0x10 |
                  uVar11 << 0x20);
        SVar6 = 0;
      }
    }
  }
  return SVar6;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAllocPtr alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize))
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc))

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)ISzAlloc_Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}